

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsItemPrivate::setFocusHelper
          (QGraphicsItemPrivate *this,FocusReason focusReason,bool climb,bool focusFromHide)

{
  QGraphicsScene *this_00;
  bool bVar1;
  QGraphicsItem *pQVar2;
  QGraphicsItemPrivate *pQVar3;
  QGraphicsItem *pQVar4;
  QGraphicsItem *other;
  
  if ((((this->q_ptr->d_ptr).d)->field_0x160 & 0x80) == 0) {
    return;
  }
  pQVar2 = this->q_ptr;
  if ((this->field_0x164 & 4) == 0) {
    return;
  }
  do {
    other = pQVar2;
    pQVar2 = ((other->d_ptr).d)->focusProxy;
  } while (pQVar2 != (QGraphicsItem *)0x0);
  pQVar3 = this;
  if (((QGraphicsScene *)this->scene != (QGraphicsScene *)0x0) &&
     (pQVar2 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene), pQVar2 == other)) {
    return;
  }
  do {
    pQVar2 = pQVar3->parent;
    if (pQVar2 == (QGraphicsItem *)0x0) goto LAB_00574d72;
    pQVar3 = (pQVar2->d_ptr).d;
  } while ((pQVar3->field_0x165 & 0x80) == 0);
  pQVar4 = pQVar3->focusScopeItem;
  pQVar3->focusScopeItem = this->q_ptr;
  if (pQVar4 != (QGraphicsItem *)0x0) {
    pQVar3 = (pQVar4->d_ptr).d;
    (*pQVar3->_vptr_QGraphicsItemPrivate[9])(pQVar3,0);
  }
  (*this->_vptr_QGraphicsItemPrivate[9])(this,1);
  if (((pQVar2->d_ptr).d)->subFocusItem == (QGraphicsItem *)0x0 && !focusFromHide) {
    return;
  }
LAB_00574d72:
  if (climb) {
    pQVar3 = (other->d_ptr).d;
    pQVar2 = other;
    do {
      other = pQVar2;
      pQVar2 = pQVar3->focusScopeItem;
      if (pQVar2 == (QGraphicsItem *)0x0) break;
      pQVar3 = (pQVar2->d_ptr).d;
    } while ((pQVar3->field_0x160 & 0x20) != 0);
  }
  if (((QGraphicsScene *)this->scene != (QGraphicsScene *)0x0) &&
     (pQVar2 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene),
     pQVar2 != (QGraphicsItem *)0x0)) {
    pQVar2 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene);
    pQVar2 = QGraphicsItem::panel(pQVar2);
    pQVar4 = QGraphicsItem::panel(this->q_ptr);
    if (pQVar2 == pQVar4) {
      pQVar2 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene);
      pQVar2 = QGraphicsItem::commonAncestorItem(pQVar2,other);
      pQVar4 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene);
      pQVar3 = (pQVar4->d_ptr).d;
      pQVar4 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene);
      clearSubFocus(pQVar3,pQVar4,pQVar2);
      goto LAB_00574ddf;
    }
  }
  pQVar2 = (QGraphicsItem *)0x0;
LAB_00574ddf:
  setSubFocus((other->d_ptr).d,other,pQVar2);
  this_00 = (QGraphicsScene *)this->scene;
  if (this_00 != (QGraphicsScene *)0x0) {
    pQVar2 = QGraphicsItem::panel(this->q_ptr);
    if (pQVar2 == (QGraphicsItem *)0x0) {
      bVar1 = QGraphicsScene::isActive(this_00);
    }
    else {
      bVar1 = QGraphicsItem::isActive(pQVar2);
    }
    if (bVar1 != false) {
      QGraphicsScenePrivate::setFocusItemHelper
                (*(QGraphicsScenePrivate **)&this->scene->field_0x8,other,focusReason,true);
      return;
    }
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::setFocusHelper(Qt::FocusReason focusReason, bool climb, bool focusFromHide)
{
    // Disabled / unfocusable items cannot accept focus.
    if (!q_ptr->isEnabled() || !(flags & QGraphicsItem::ItemIsFocusable))
        return;

    // Find focus proxy.
    QGraphicsItem *f = q_ptr;
    while (f->d_ptr->focusProxy)
        f = f->d_ptr->focusProxy;

    // Return if it already has focus.
    if (scene && scene->focusItem() == f)
        return;

    // Update focus scope item ptr.
    QGraphicsItem *p = parent;
    while (p) {
        if (p->flags() & QGraphicsItem::ItemIsFocusScope) {
            QGraphicsItem *oldFocusScopeItem = p->d_ptr->focusScopeItem;
            p->d_ptr->focusScopeItem = q_ptr;
            if (oldFocusScopeItem)
                oldFocusScopeItem->d_ptr->focusScopeItemChange(false);
            focusScopeItemChange(true);
            if (!p->focusItem() && !focusFromHide) {
                // Calling setFocus() on a child of a focus scope that does
                // not have focus changes only the focus scope pointer,
                // so that focus is restored the next time the scope gains
                // focus.
                return;
            }
            break;
        }
        p = p->d_ptr->parent;
    }

    if (climb) {
        while (f->d_ptr->focusScopeItem && f->d_ptr->focusScopeItem->isVisible())
            f = f->d_ptr->focusScopeItem;
    }

    // Update the child focus chain.
    QGraphicsItem *commonAncestor = nullptr;
    if (scene && scene->focusItem() && scene->focusItem()->panel() == q_ptr->panel()) {
        commonAncestor = scene->focusItem()->commonAncestorItem(f);
        scene->focusItem()->d_ptr->clearSubFocus(scene->focusItem(), commonAncestor);
    }

    f->d_ptr->setSubFocus(f, commonAncestor);

    // Update the scene's focus item.
    if (scene) {
        QGraphicsItem *p = q_ptr->panel();
        if ((!p && scene->isActive()) || (p && p->isActive())) {
            // Visible items immediately gain focus from scene.
            scene->d_func()->setFocusItemHelper(f, focusReason);
        }
    }
}